

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O3

int AF_ACustomBridge_A_BridgeInit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  VMValue *pVVar6;
  PClassActor *type;
  AActor *self;
  AActor *pAVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  double local_58;
  DVector3 local_48;
  PClass *pPVar5;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_004b2a4d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004b2a3d:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004b2a4d:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                  ,0x7f,
                  "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar7 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar7 == (AActor *)0x0) goto LAB_004b2908;
    pPVar5 = (pAVar7->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar3 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pAVar7->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar11 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar11) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar11 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar11) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004b2a4d;
    }
  }
  else {
    if (pAVar7 != (AActor *)0x0) goto LAB_004b2a3d;
LAB_004b2908:
    pAVar7 = (AActor *)0x0;
  }
  if (numparam != 1) {
    if (param[1].field_0.field_3.Type == '\x03') {
      pVVar6 = param + 1;
      if (param[1].field_0.field_1.atag == 1) goto LAB_004b294a;
      if ((pVVar6->field_0).field_1.a == (void *)0x0) goto LAB_004b295e;
    }
    pcVar9 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
    goto LAB_004b2a6c;
  }
  pVVar1 = defaultparam->Array;
  if (pVVar1[1].field_0.field_3.Type != '\x03') {
LAB_004b2928:
    pcVar9 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
    ;
LAB_004b2a6c:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                  ,0x80,
                  "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pVVar6 = pVVar1 + 1;
  if (pVVar1[1].field_0.field_1.atag == 1) {
LAB_004b294a:
    type = (PClassActor *)(pVVar6->field_0).field_1.a;
    if (type != (PClassActor *)0x0) goto LAB_004b296d;
  }
  else if ((pVVar6->field_0).field_1.a != (void *)0x0) goto LAB_004b2928;
LAB_004b295e:
  type = PClass::FindActor("BridgeBall");
LAB_004b296d:
  uVar4 = FRandom::GenRand32(&pr_orbit);
  uVar8 = 3;
  if (pAVar7->args[2] != 0) {
    uVar8 = pAVar7->args[2];
  }
  if (0 < (int)uVar8) {
    local_58 = 0.0;
    uVar10 = uVar8;
    do {
      local_48.X = (pAVar7->__Pos).X;
      local_48.Y = (pAVar7->__Pos).Y;
      local_48.Z = (pAVar7->__Pos).Z;
      self = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
      (self->Angles).Yaw.Degrees =
           (double)(int)(0x100 / (ulong)uVar8) * 1.40625 * local_58 +
           (double)(uVar4 & 0xff) * 1.40625;
      (self->target).field_0.p = pAVar7;
      BridgeOrbit(self);
      local_58 = local_58 + 1.0;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(ACustomBridge, A_BridgeInit)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(balltype, AActor);

	AActor *ball;

	if (balltype == NULL)
	{
		balltype = PClass::FindActor("BridgeBall");
	}

	DAngle startangle = pr_orbit() * (360./256.);

	// Spawn triad into world -- may be more than a triad now.
	int ballcount = self->args[2]==0 ? 3 : self->args[2];

	for (int i = 0; i < ballcount; i++)
	{
		ball = Spawn(balltype, self->Pos(), ALLOW_REPLACE);
		ball->Angles.Yaw = startangle + (45./32) * (256/ballcount) * i;
		ball->target = self;
		BridgeOrbit(ball);
	}
	return 0;
}